

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::Decode(MunitionDescriptor *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  MunitionDescriptor *this_local;
  
  Descriptor::Decode(&this->super_Descriptor,stream);
  pKVar1 = KDataStream::operator>>(stream,&this->m_ui16Warhead);
  pKVar1 = KDataStream::operator>>(pKVar1,&this->m_ui16Fuse);
  pKVar1 = KDataStream::operator>>(pKVar1,&this->m_ui16Quantity);
  KDataStream::operator>>(pKVar1,&this->m_ui16Rate);
  return;
}

Assistant:

void MunitionDescriptor::Decode(KDataStream &stream) noexcept(false)
{
	Descriptor::Decode( stream );

    stream >> m_ui16Warhead
           >> m_ui16Fuse
           >> m_ui16Quantity
           >> m_ui16Rate;
}